

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_constant_expression.cpp
# Opt level: O2

uint32_t bitfield_insert(uint32_t base,uint32_t insert,int offset,int bits)

{
  uint32_t uVar1;
  
  if (bits != 0) {
    uVar1 = 0;
    if (bits + offset < 0x21 && -1 < (bits | offset)) {
      uVar1 = (insert << ((byte)offset & 0x1f) ^ base) &
              ~(uint)(-1L << ((byte)bits & 0x3f)) << ((byte)offset & 0x3f) ^ base;
    }
    return uVar1;
  }
  return base;
}

Assistant:

static uint32_t
bitfield_insert(uint32_t base, uint32_t insert, int offset, int bits)
{
   if (bits == 0)
      return base;
   else if (offset < 0 || bits < 0)
      return 0; /* Undefined, per spec. */
   else if (offset + bits > 32)
      return 0; /* Undefined, per spec. */
   else {
      unsigned insert_mask = ((1ull << bits) - 1) << offset;

      insert <<= offset;
      insert &= insert_mask;
      base &= ~insert_mask;

      return base | insert;
   }
}